

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O2

io_service * __thiscall cppcms::impl::tcp_cache_service::server::get_next_io_service(server *this)

{
  ulong uVar1;
  size_t sVar2;
  pointer ppiVar3;
  
  sVar2 = this->counter;
  ppiVar3 = (this->services_).
            super__Vector_base<booster::aio::io_service_*,_std::allocator<booster::aio::io_service_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = sVar2 + 1;
  this->counter = uVar1;
  if ((ulong)((long)(this->services_).
                    super__Vector_base<booster::aio::io_service_*,_std::allocator<booster::aio::io_service_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppiVar3 >> 3) <= uVar1) {
    this->counter = 0;
  }
  return ppiVar3[(int)sVar2];
}

Assistant:

io::io_service &get_next_io_service()
	{
		int id = counter++;
		if(counter >= services_.size())
			counter = 0;
		return *services_[id];
	}